

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::JavaHprofConfig::operator==(JavaHprofConfig *this,JavaHprofConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  JavaHprofConfig *other_local;
  JavaHprofConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = ::std::operator==(&this->process_cmdline_,&other->process_cmdline_);
    local_19 = false;
    if (bVar2) {
      bVar2 = ::std::operator==(&this->pid_,&other->pid_);
      local_19 = false;
      if (bVar2) {
        bVar2 = ::std::operator==(&this->target_installed_by_,&other->target_installed_by_);
        local_19 = false;
        if (bVar2) {
          bVar2 = protozero::operator==
                            (&this->continuous_dump_config_,&other->continuous_dump_config_);
          local_19 = false;
          if (((bVar2) &&
              (local_19 = false, this->min_anonymous_memory_kb_ == other->min_anonymous_memory_kb_))
             && (local_19 = false, (this->dump_smaps_ & 1U) == (other->dump_smaps_ & 1U))) {
            local_19 = ::std::operator==(&this->ignored_types_,&other->ignored_types_);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool JavaHprofConfig::operator==(const JavaHprofConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && process_cmdline_ == other.process_cmdline_
   && pid_ == other.pid_
   && target_installed_by_ == other.target_installed_by_
   && continuous_dump_config_ == other.continuous_dump_config_
   && min_anonymous_memory_kb_ == other.min_anonymous_memory_kb_
   && dump_smaps_ == other.dump_smaps_
   && ignored_types_ == other.ignored_types_;
}